

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O3

void mp_rshift_safe_in_place(mp_int *r,size_t bits)

{
  ulong uVar1;
  BignumInt *pBVar2;
  long lVar3;
  byte bVar4;
  uint bit;
  ulong uVar5;
  BignumInt BVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar1 = r->nw;
  if (uVar1 != 0) {
    pBVar2 = r->w;
    uVar5 = 0;
    do {
      if ((long)(uVar1 - (bits >> 6)) < 0) {
        BVar6 = 0;
      }
      else {
        BVar6 = pBVar2[uVar5];
      }
      pBVar2[uVar5] = BVar6;
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
    bVar4 = 0;
    do {
      uVar5 = 1L << (bVar4 & 0x3f);
      uVar7 = 0;
      do {
        if (uVar5 + uVar7 < uVar1) {
          BVar6 = pBVar2[uVar5 + uVar7];
        }
        else {
          BVar6 = 0;
        }
        if ((uVar5 & bits >> 6) == 0) {
          BVar6 = pBVar2[uVar7];
        }
        pBVar2[uVar7] = BVar6;
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
      bVar4 = bVar4 + 1;
    } while (uVar1 >> (bVar4 & 0x3f) != 0);
  }
  lVar3 = 0;
  do {
    if (uVar1 != 0) {
      bVar4 = (byte)(1 << ((byte)lVar3 & 0x1f));
      pBVar2 = r->w;
      uVar5 = 1;
      do {
        if (uVar5 < uVar1) {
          BVar6 = pBVar2[uVar5];
        }
        else {
          BVar6 = 0;
        }
        uVar7 = BVar6 << (0x40 - bVar4 & 0x3f) | pBVar2[uVar5 - 1] >> (bVar4 & 0x3f);
        if (((uint)(1L << ((byte)lVar3 & 0x3f)) & (uint)bits & 0x3f) == 0) {
          uVar7 = pBVar2[uVar5 - 1];
        }
        pBVar2[uVar5 - 1] = uVar7;
        bVar8 = uVar5 != uVar1;
        uVar5 = uVar5 + 1;
      } while (bVar8);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  return;
}

Assistant:

static void mp_rshift_safe_in_place(mp_int *r, size_t bits)
{
    size_t wordshift = bits / BIGNUM_INT_BITS;
    size_t bitshift = bits % BIGNUM_INT_BITS;

    unsigned clear = (r->nw - wordshift) >> (CHAR_BIT * sizeof(size_t) - 1);
    mp_cond_clear(r, clear);

    for (unsigned bit = 0; r->nw >> bit; bit++) {
        size_t word_offset = (size_t)1 << bit;
        BignumInt mask = -(BignumInt)((wordshift >> bit) & 1);
        for (size_t i = 0; i < r->nw; i++) {
            BignumInt w = mp_word(r, i + word_offset);
            r->w[i] ^= (r->w[i] ^ w) & mask;
        }
    }

    /*
     * That's done the shifting by words; now we do the shifting by
     * bits.
     */
    for (unsigned bit = 0; bit < BIGNUM_INT_BITS_BITS; bit++) {
        unsigned shift = 1 << bit, upshift = BIGNUM_INT_BITS - shift;
        BignumInt mask = -(BignumInt)((bitshift >> bit) & 1);
        for (size_t i = 0; i < r->nw; i++) {
            BignumInt w = ((r->w[i] >> shift) | (mp_word(r, i+1) << upshift));
            r->w[i] ^= (r->w[i] ^ w) & mask;
        }
    }
}